

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O1

void __thiscall
SStringViewRelational_Ne_Test<(anonymous_namespace)::sstringview_maker>::
~SStringViewRelational_Ne_Test
          (SStringViewRelational_Ne_Test<(anonymous_namespace)::sstringview_maker> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SStringViewRelational, Ne) {
#define NE(lhs, rhs, x)                                                                            \
    do {                                                                                           \
        auto const lhs_view = pstore::make_sstring_view ((lhs), std::strlen (lhs));                \
        EXPECT_EQ (lhs_view != (rhs), (x));                                                        \
        EXPECT_EQ ((rhs) != lhs_view, (x));                                                        \
    } while (0)
    NE ("", TypeParam (""), false);
    NE ("", TypeParam ("abcde"), true);
    NE ("", TypeParam ("abcdefghij"), true);
    NE ("", TypeParam ("abcdefghijklmnopqrst"), true);
    NE ("abcde", TypeParam (""), true);
    NE ("abcde", TypeParam ("abcde"), false);
    NE ("abcde", TypeParam ("abcdefghij"), true);
    NE ("abcde", TypeParam ("abcdefghijklmnopqrst"), true);
    NE ("abcdefghij", TypeParam (""), true);
    NE ("abcdefghij", TypeParam ("abcde"), true);
    NE ("abcdefghij", TypeParam ("abcdefghij"), false);
    NE ("abcdefghij", TypeParam ("abcdefghijklmnopqrst"), true);
    NE ("abcdefghijklmnopqrst", TypeParam (""), true);
    NE ("abcdefghijklmnopqrst", TypeParam ("abcde"), true);
    NE ("abcdefghijklmnopqrst", TypeParam ("abcdefghij"), true);
    NE ("abcdefghijklmnopqrst", TypeParam ("abcdefghijklmnopqrst"), false);
#undef NE
}